

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StableVector.h
# Opt level: O2

GeometryData * __thiscall
Rml::StableVector<Rml::RenderManager::GeometryData>::erase
          (GeometryData *__return_storage_ptr__,StableVector<Rml::RenderManager::GeometryData> *this
          ,StableVectorIndex index)

{
  code *pcVar1;
  bool bVar2;
  ulong __n;
  reference rVar3;
  GeometryData local_58;
  
  __n = (ulong)index;
  if (__n < (ulong)(((long)(this->elements).
                           super__Vector_base<Rml::RenderManager::GeometryData,_std::allocator<Rml::RenderManager::GeometryData>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(this->elements).
                          super__Vector_base<Rml::RenderManager::GeometryData,_std::allocator<Rml::RenderManager::GeometryData>_>
                          ._M_impl.super__Vector_impl_data._M_start) / 0x38)) {
    rVar3 = ::std::vector<bool,_std::allocator<bool>_>::operator[](&this->free_slots,__n);
    if ((*rVar3._M_p & rVar3._M_mask) == 0) goto LAB_002c0567;
  }
  bVar2 = Assert("RMLUI_ASSERT(size_t(index) < elements.size() && !free_slots[size_t(index)])",
                 "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/../../Include/RmlUi/Core/StableVector.h"
                 ,0x5d);
  if (!bVar2) {
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
LAB_002c0567:
  rVar3 = ::std::vector<bool,_std::allocator<bool>_>::operator[](&this->free_slots,__n);
  *rVar3._M_p = *rVar3._M_p | rVar3._M_mask;
  local_58.mesh.indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.mesh.indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_58.mesh.vertices.super__Vector_base<Rml::Vertex,_std::allocator<Rml::Vertex>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_58.mesh.indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.mesh.vertices.super__Vector_base<Rml::Vertex,_std::allocator<Rml::Vertex>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.mesh.vertices.super__Vector_base<Rml::Vertex,_std::allocator<Rml::Vertex>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.handle = 0;
  ::std::__exchange<Rml::RenderManager::GeometryData,Rml::RenderManager::GeometryData>
            (__return_storage_ptr__,
             (this->elements).
             super__Vector_base<Rml::RenderManager::GeometryData,_std::allocator<Rml::RenderManager::GeometryData>_>
             ._M_impl.super__Vector_impl_data._M_start + __n,&local_58);
  Mesh::~Mesh(&local_58.mesh);
  return __return_storage_ptr__;
}

Assistant:

T erase(StableVectorIndex index)
	{
		RMLUI_ASSERT(size_t(index) < elements.size() && !free_slots[size_t(index)]);
		free_slots[size_t(index)] = true;
		return std::exchange(elements[size_t(index)], T());
	}